

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O1

void __thiscall RegionChecker::printRange(RegionChecker *this,int from,int to)

{
  _Bit_type *p_Var1;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  iVar6 = to - from;
  bVar9 = iVar6 != 0 && from <= to;
  if (iVar6 != 0 && from <= to) {
    p_Var1 = (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar4 = (ulong)from;
    uVar8 = uVar4 + 0x3f;
    if (-1 < (long)uVar4) {
      uVar8 = uVar4;
    }
    if ((p_Var1[((long)uVar8 >> 6) +
                (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
         ((ulong)(uint)from & 0x3f) & 1) == 0) {
      iVar7 = ~from + to;
      do {
        bVar9 = iVar7 == 0;
        iVar7 = iVar7 + -1;
        if (bVar9) {
          return;
        }
        uVar5 = uVar4 + 1;
        uVar8 = uVar4 + 0x40;
        if (-1 < (long)uVar5) {
          uVar8 = uVar5;
        }
        uVar4 = uVar5;
      } while ((p_Var1[((long)uVar8 >> 6) +
                       (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) +
                       0xffffffffffffffff] >> (uVar5 & 0x3f) & 1) == 0);
      bVar9 = (long)uVar5 < (long)to;
    }
    if (bVar9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size: ",6);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," Start: ",8);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,from);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," End: ",6);
      plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,to);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void RegionChecker::printRange(int from, int to) const {
	for (int i = from; i < to; i++) {
		if (fileUsage[i]) {
			goto nonzero;
		}
	}
	return;
nonzero:
	std::cout << "Size: " << (to - from) << " Start: " << from << " End: " << to << std::endl;
}